

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

int Jf_ManComputeRefs(Jf_Man_t *p)

{
  int *piVar1;
  float fVar2;
  int *piVar3;
  float *pfVar4;
  float *pfVar5;
  Jf_Par_t *pJVar6;
  Gia_Man_t *pGVar7;
  Gia_Obj_t *pGVar8;
  word *pwVar9;
  bool bVar10;
  float fVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  Gia_Obj_t *pGVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  float fVar21;
  word local_40;
  word local_38;
  
  piVar3 = p->pGia->pRefs;
  if (piVar3 == (int *)0x0) {
    __assert_fail("p->pGia->pRefs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x522,"int Jf_ManComputeRefs(Jf_Man_t *)");
  }
  pfVar4 = (p->vRefs).pArray;
  pfVar5 = (p->vFlow).pArray;
  memset(piVar3,0,(long)p->pGia->nObjs << 2);
  pJVar6 = p->pPars;
  pJVar6->Area = 0;
  pJVar6->Edge = 0;
  pGVar7 = p->pGia;
  if (0 < (long)pGVar7->nObjs) {
    local_38 = 0;
    local_40 = 0;
    lVar18 = (long)pGVar7->nObjs;
    do {
      uVar13 = pGVar7->nObjs;
      if ((int)uVar13 < lVar18) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar8 = pGVar7->pObjs;
      if (pGVar8 == (Gia_Obj_t *)0x0) goto LAB_007648f4;
      lVar19 = lVar18 + -1;
      uVar17 = *(ulong *)(pGVar8 + lVar19);
      uVar15 = (uint)uVar17;
      uVar20 = uVar17 & 0x1fffffff;
      if ((int)uVar15 < 0 && uVar20 != 0x1fffffff) {
LAB_00764793:
        pGVar16 = pGVar8 + lVar19 + -uVar20;
        if ((pGVar16 < pGVar8) || (pGVar8 + (int)uVar13 <= pGVar16)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        pGVar7->pRefs[(int)((ulong)((long)pGVar16 - (long)pGVar8) >> 2) * -0x55555555] =
             pGVar7->pRefs[(int)((ulong)((long)pGVar16 - (long)pGVar8) >> 2) * -0x55555555] + 1;
      }
      else {
        if (-1 < (int)uVar15) {
          if (((uVar15 & 0x1fffffff) != 0x1fffffff) &&
             ((uVar15 & 0x1fffffff) == ((uint)(uVar17 >> 0x20) & 0x1fffffff))) goto LAB_00764793;
        }
        if (((int)uVar20 != 0x1fffffff && -1 < (int)uVar15) &&
           (piVar3 = pGVar7->pRefs, 0 < piVar3[lVar19])) {
          if ((uVar15 >> 0x1e & 1) != 0) {
            __assert_fail("Jf_ObjIsUnit(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                          ,0x52b,"int Jf_ManComputeRefs(Jf_Man_t *)");
          }
          if ((p->vCuts).nSize < lVar18) {
LAB_00764a37:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar13 = (p->vCuts).pArray[lVar19];
          pwVar9 = (p->pMem).pPages[(int)uVar13 >> ((byte)(p->pMem).nPageSize & 0x1f)];
          lVar14 = (long)(int)(uVar13 & (p->pMem).uPageMask);
          uVar13 = *(uint *)((long)pwVar9 + lVar14 * 8 + 4);
          if ((uVar13 & 0xf) != 0) {
            uVar17 = 0;
            do {
              uVar13 = *(uint *)((long)pwVar9 + uVar17 * 4 + lVar14 * 8 + 8);
              if ((int)uVar13 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              piVar1 = piVar3 + (uVar13 >> 1);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)((long)pwVar9 + lVar14 * 8 + 4);
              uVar17 = uVar17 + 1;
            } while (uVar17 < (uVar13 & 0xf));
          }
          if (pJVar6->fGenCnf != 0) {
            if (p->vCnfs->nSize <= (int)(uVar13 >> 9)) goto LAB_00764a37;
            pJVar6->Clause = pJVar6->Clause + (long)p->vCnfs->pArray[uVar13 >> 9];
          }
          local_40 = local_40 + (uVar13 & 0xf);
          pJVar6->Edge = local_40;
          local_38 = local_38 + 1;
          pJVar6->Area = local_38;
        }
      }
      bVar10 = 1 < lVar18;
      lVar18 = lVar19;
    } while (bVar10);
    uVar13 = pGVar7->nObjs;
LAB_007648f4:
    if (0 < (int)uVar13) {
      iVar12 = pJVar6->fOptEdge;
      piVar3 = pGVar7->pRefs;
      uVar17 = 0;
      do {
        fVar2 = pfVar4[uVar17];
        if (iVar12 == 0) {
          fVar11 = (float)piVar3[uVar17] * 0.8;
          fVar21 = 0.2;
        }
        else {
          fVar11 = (float)piVar3[uVar17] * 0.2;
          fVar21 = 0.8;
        }
        fVar11 = fVar2 * fVar21 + fVar11;
        fVar21 = 1.0;
        if (1.0 <= fVar11) {
          fVar21 = fVar11;
        }
        pfVar5[uVar17] = (fVar2 * pfVar5[uVar17]) / fVar21;
        pfVar4[uVar17] = fVar21;
        if (pfVar5[uVar17] < 0.0) {
          __assert_fail("pFlow[i] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                        ,0x53d,"int Jf_ManComputeRefs(Jf_Man_t *)");
        }
        uVar17 = uVar17 + 1;
      } while (uVar13 != uVar17);
    }
  }
  iVar12 = Jf_ManComputeDelay(p,1);
  pJVar6 = p->pPars;
  pJVar6->Delay = (long)iVar12;
  return (int)pJVar6->Area;
}

Assistant:

int Jf_ManComputeRefs( Jf_Man_t * p )
{
    Gia_Obj_t * pObj; 
    float nRefsNew; int i, * pCut;
    float * pRefs = Vec_FltArray(&p->vRefs);
    float * pFlow = Vec_FltArray(&p->vFlow);
    assert( p->pGia->pRefs != NULL );
    memset( p->pGia->pRefs, 0, sizeof(int) * Gia_ManObjNum(p->pGia) );
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachObjReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCo(pObj) || Gia_ObjIsBuf(pObj) )
            Gia_ObjRefInc( p->pGia, Gia_ObjFanin0(pObj) );
        else if ( Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p->pGia, pObj) > 0 )
        {
            assert( Jf_ObjIsUnit(pObj) );
            pCut = Jf_ObjCutBest(p, i);
            Jf_CutRef( p, pCut );
            if ( p->pPars->fGenCnf )
            p->pPars->Clause += Jf_CutCnfSize(p, pCut);
            p->pPars->Edge += Jf_CutSize(pCut);
            p->pPars->Area++;
        }
    }
    // blend references and normalize flow
    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
    {
        if ( p->pPars->fOptEdge )
            nRefsNew = Abc_MaxFloat( 1, 0.8 * pRefs[i] + 0.2 * p->pGia->pRefs[i] );
        else
            nRefsNew = Abc_MaxFloat( 1, 0.2 * pRefs[i] + 0.8 * p->pGia->pRefs[i] );
        pFlow[i] = pFlow[i] * pRefs[i] / nRefsNew;
        pRefs[i] = nRefsNew;
        assert( pFlow[i] >= 0 );
    }
    // compute delay
    p->pPars->Delay = Jf_ManComputeDelay( p, 1 );
    return p->pPars->Area;
}